

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::~SimpleHashTable(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                   *this)

{
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  EntryType *current;
  EntryType *pEVar2;
  ulong uVar3;
  
  if (this->size != 0) {
    uVar3 = 0;
    do {
      pEVar2 = this->table[uVar3];
      while (pEVar2 != (EntryType *)0x0) {
        pSVar1 = pEVar2->next;
        Memory::HeapAllocator::Free(this->allocator,pEVar2,0x20);
        pEVar2 = pSVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->size);
  }
  while (pEVar2 = this->free, pEVar2 != (EntryType *)0x0) {
    this->free = pEVar2->next;
    Memory::HeapAllocator::Free(this->allocator,pEVar2,0x20);
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,(ulong)this->size,this->table);
  return;
}

Assistant:

~SimpleHashTable()
    {
        for (uint i = 0; i < size; i++)
        {
            EntryType * entry = table[i];
            while (entry != nullptr)
            {
                EntryType * next = entry->next;
                AllocatorDelete(TAllocator, allocator, entry);
                entry = next;
            }
        }

        while(free)
        {
            EntryType* current = free;
            free = current->next;
            AllocatorDelete(TAllocator, allocator, current);
        }
        AllocatorDeleteArray(TAllocator, allocator,  size, table);
    }